

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O3

void __thiscall
ImGuiSelectionBasicStorage::ImGuiSelectionBasicStorage(ImGuiSelectionBasicStorage *this)

{
  (this->_Storage).Data.Size = 0;
  (this->_Storage).Data.Capacity = 0;
  (this->_Storage).Data.Data = (ImGuiStoragePair *)0x0;
  this->Size = 0;
  this->PreserveOrder = false;
  this->UserData = (void *)0x0;
  this->AdapterIndexToStorageId = ImGuiSelectionBasicStorage::anon_class_1_0_00000001::__invoke;
  this->_SelectionOrder = 1;
  return;
}

Assistant:

inline ~ImVector()                                      { if (Data) IM_FREE(Data); }